

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

size_t google::protobuf::io::CodedOutputStream::VarintSize64(uint64_t value)

{
  type_conflict tVar1;
  uint32_t log2value;
  uint64_t value_local;
  
  tVar1 = absl::lts_20250127::countl_zero<unsigned_long>(value | 1);
  return (ulong)((0x3f - tVar1) * 9 + 0x49U >> 6);
}

Assistant:

inline size_t CodedOutputStream::VarintSize64(uint64_t value) {
#if PROTOBUF_CODED_STREAM_H_PREFER_BSR
  // Explicit OR 0x1 to avoid calling absl::countl_zero(0), which
  // requires a branch to check for on platforms without a clz instruction.
  uint32_t log2value = (std::numeric_limits<uint64_t>::digits - 1) -
                       absl::countl_zero(value | 0x1);
  return static_cast<size_t>((log2value * 9 + (64 + 9)) / 64);
#else
  uint32_t clz = absl::countl_zero(value);
  return static_cast<size_t>(
      ((std::numeric_limits<uint64_t>::digits * 9 + 64) - (clz * 9)) / 64);
#endif
}